

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

void normalizeLines(XML_Char *s)

{
  XML_Char *pXVar1;
  XML_Char *local_18;
  XML_Char *p;
  XML_Char *s_local;
  
  p = s;
  while( true ) {
    if (*p == '\0') {
      return;
    }
    if (*p == '\r') break;
    p = p + 1;
  }
  local_18 = p;
  do {
    if (*p == '\r') {
      *local_18 = '\n';
      pXVar1 = p + 1;
      if (p[1] == '\n') {
        pXVar1 = p + 2;
      }
    }
    else {
      *local_18 = *p;
      pXVar1 = p + 1;
    }
    p = pXVar1;
    local_18 = local_18 + 1;
  } while (*p != '\0');
  *local_18 = '\0';
  return;
}

Assistant:

static void
normalizeLines(XML_Char *s)
{
  XML_Char *p;
  for (;; s++) {
    if (*s == XML_T('\0'))
      return;
    if (*s == 0xD)
      break;
  }
  p = s;
  do {
    if (*s == 0xD) {
      *p++ = 0xA;
      if (*++s == 0xA)
        s++;
    }
    else
      *p++ = *s++;
  } while (*s);
  *p = XML_T('\0');
}